

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# welcome_message_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::price::pixie::WelcomeMessageTest_test_get_options_may_be_read_from_the_wire_Test::
TestBody(WelcomeMessageTest_test_get_options_may_be_read_from_the_wire_Test *this)

{
  char *message_00;
  AssertHelper local_68;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  AssertionResult gtest_ar;
  string local_48 [32];
  WelcomeMessage message;
  
  std::__cxx11::string::string<std::allocator<char>>
            (local_48,"570701000010e1000026ae",(allocator<char> *)&gtest_ar);
  ReadWelcomeMessage((string *)&message);
  std::__cxx11::string::~string(local_48);
  local_60.ptr_._0_4_ = 7;
  local_68.data_._0_4_ = bidfx_public_api::price::pixie::WelcomeMessage::GetOptions();
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&gtest_ar,"7","message.GetOptions()",(int *)&local_60,(uint *)&local_68);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_60);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message_00 = "";
    }
    else {
      message_00 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/welcome_message_test.cpp"
               ,0x3f,message_00);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_60);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(WelcomeMessageTest, test_get_options_may_be_read_from_the_wire)
{
    WelcomeMessage message = ReadWelcomeMessage("570701000010e1000026ae");
    ASSERT_EQ(7, message.GetOptions());
}